

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tls.cpp
# Opt level: O3

ssize_t __thiscall xmrig::Client::Tls::read(Tls *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  X509 *a;
  ssize_t extraout_RAX;
  undefined4 extraout_var_01;
  ssize_t sVar3;
  undefined4 extraout_var_02;
  void *__buf_00;
  int __fd_00;
  undefined4 in_register_00000034;
  int in_R8D;
  undefined4 in_register_00000084;
  size_t in_R9;
  undefined1 auVar5 [16];
  X509 *pXVar4;
  
  BIO_write((BIO *)this->m_readBio,(void *)CONCAT44(in_register_00000034,__fd),(int)__buf);
  iVar1 = SSL_is_init_finished(this->m_ssl);
  if (iVar1 == 0) {
    iVar1 = SSL_connect((SSL *)this->m_ssl);
    sVar3 = CONCAT44(extraout_var_00,iVar1);
    if (iVar1 < 0) {
      iVar1 = SSL_get_error((SSL *)this->m_ssl,iVar1);
      sVar3 = CONCAT44(extraout_var_01,iVar1);
      if (iVar1 == 2) {
        sVar3 = Client::send(this->m_client,(int)this->m_writeBio,__buf_00,__nbytes,in_R8D);
        return sVar3;
      }
    }
    else if (iVar1 == 1) {
      auVar5 = SSL_get1_peer_certificate(this->m_ssl);
      a = auVar5._0_8_;
      pXVar4 = a;
      iVar1 = verify(this,(EVP_PKEY_CTX *)a,auVar5._8_8_,__nbytes,
                     (uchar *)CONCAT44(in_register_00000084,in_R8D),in_R9);
      __fd_00 = (int)pXVar4;
      X509_free(a);
      if ((char)iVar1 != '\0') {
        this->m_ready = true;
        login(this->m_client);
        return extraout_RAX;
      }
      iVar1 = close(this->m_client,__fd_00);
      return CONCAT44(extraout_var_02,iVar1);
    }
  }
  else {
    while( true ) {
      uVar2 = SSL_read((SSL *)this->m_ssl,this->m_buf,0x800);
      sVar3 = CONCAT44(extraout_var,uVar2);
      if ((int)uVar2 < 1) break;
      this->m_buf[uVar2 - 1] = '\0';
      parse(this->m_client,this->m_buf,(ulong)uVar2);
    }
  }
  return sVar3;
}

Assistant:

void xmrig::Client::Tls::read(const char *data, size_t size)
{
    BIO_write(m_readBio, data, size);

    if (!SSL_is_init_finished(m_ssl)) {
        const int rc = SSL_connect(m_ssl);

        if (rc < 0 && SSL_get_error(m_ssl, rc) == SSL_ERROR_WANT_READ) {
            send();
        } else if (rc == 1) {
            X509 *cert = SSL_get_peer_certificate(m_ssl);
            if (!verify(cert)) {
                X509_free(cert);
                m_client->close();

                return;
            }

            X509_free(cert);
            m_ready = true;
            m_client->login();
      }

      return;
    }

    int bytes_read = 0;
    while ((bytes_read = SSL_read(m_ssl, m_buf, sizeof(m_buf))) > 0) {
        m_buf[bytes_read - 1] = '\0';
        m_client->parse(m_buf, static_cast<size_t>(bytes_read));
    }
}